

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O2

void Exa3_ManExactSynthesis2(Bmc_EsPar_t *pPars)

{
  int (*paiVar1) [32];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  abctime aVar8;
  Exa3_Man_t_conflict *p;
  Vec_Wec_t *p_00;
  Vec_Wrd_t *pVVar9;
  word *pwVar10;
  sat_solver *s;
  ulong uVar11;
  Vec_Int_t *pVVar12;
  word *pwVar13;
  word *pIn2;
  byte bVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  lit *end;
  abctime time;
  abctime time_00;
  int (*paaiVar19) [6] [32];
  uint uVar20;
  long lVar21;
  int (*paaiVar22) [6] [32];
  int (*paiVar23) [32];
  char *pcVar24;
  Bmc_EsPar_t *pBVar25;
  int iVar26;
  uint uVar27;
  long lVar28;
  int local_1b0;
  int iMint;
  int local_1a4;
  int local_1a0;
  int local_19c;
  int (*local_198) [32];
  Bmc_EsPar_t *local_190;
  int (*local_188) [6] [32];
  int (*local_180) [6] [32];
  ulong local_178;
  int (*local_170) [6] [32];
  ulong local_168;
  ulong local_160;
  int (*local_158) [32];
  int (*local_150) [6] [32];
  ulong local_148;
  abctime local_140;
  int pLits [32];
  word pTruth [16];
  
  iMint = 1;
  aVar8 = Abc_Clock();
  Abc_TtReadHex(pTruth,pPars->pTtStr);
  iVar4 = pPars->nVars;
  lVar21 = (long)iVar4;
  if (10 < lVar21) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                  ,0x527,"void Exa3_ManExactSynthesis2(Bmc_EsPar_t *)");
  }
  iVar3 = pPars->nLutSize;
  local_140 = aVar8;
  if (6 < iVar3) {
    __assert_fail("pPars->nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                  ,0x528,"void Exa3_ManExactSynthesis2(Bmc_EsPar_t *)");
  }
  p = (Exa3_Man_t_conflict *)calloc(1,0x60c8);
  p->pPars = pPars;
  p->nVars = iVar4;
  iVar2 = pPars->nNodes;
  p->nNodes = iVar2;
  p->nLutSize = iVar3;
  uVar20 = ~(-1 << ((byte)iVar3 & 0x1f));
  p->LutMask = uVar20;
  iVar26 = iVar2 + iVar4;
  p->nObjs = iVar26;
  iVar15 = 1 << ((char)iVar4 - 6U & 0x1f);
  if (iVar4 < 7) {
    iVar15 = 1;
  }
  p->nWords = iVar15;
  p->pTruth = pTruth;
  local_190 = pPars;
  p_00 = Vec_WecStart(iVar26);
  p->vOutLits = p_00;
  if (0x20 < iVar26) {
    __assert_fail("p->nObjs <= MAJ_NOBJS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                  ,0x3ad,"int Exa3_ManMarkup(Exa3_Man_t *)");
  }
  p->iVar = iVar2 * uVar20 + 1;
  local_150 = p->VarMarks;
  paaiVar19 = p->VarMarks + lVar21;
  for (; lVar21 < iVar26; lVar21 = lVar21 + 1) {
    local_180 = local_150 + lVar21;
    local_188 = paaiVar19;
    for (lVar16 = 0; lVar16 < iVar3; lVar16 = lVar16 + 1) {
      if (local_190->fFewerVars == 0) {
        lVar28 = 0;
LAB_004a84e0:
        for (; lVar28 < lVar21 - lVar16; lVar28 = lVar28 + 1) {
          iVar4 = p->iVar;
          iVar3 = Abc_Var2Lit(iVar4,0);
          Vec_WecPush(p_00,(int)lVar28,iVar3);
          p->iVar = iVar4 + 1;
          (*paaiVar19)[0][lVar28] = iVar4;
        }
      }
      else {
        if (lVar16 != 0) {
LAB_004a84d6:
          lVar28 = (long)(int)(iVar3 + ~(uint)lVar16);
          goto LAB_004a84e0;
        }
        iVar4 = p->nObjs;
        local_1b0 = (int)lVar21;
        if (iVar4 + -1 != local_1b0) goto LAB_004a84d6;
        iVar3 = p->iVar;
        iVar2 = Abc_Var2Lit(iVar3,0);
        Vec_WecPush(p_00,iVar4 + -2,iVar2);
        p->iVar = iVar3 + 1;
        *(int *)((long)(local_180 + -1) + 0x2f8 + (long)iVar4 * 4) = iVar3;
      }
      iVar3 = p->nLutSize;
      paaiVar19 = (int (*) [6] [32])(*paaiVar19 + 1);
    }
    iVar26 = p->nObjs;
    paaiVar19 = local_188 + 1;
  }
  uVar20 = p->iVar;
  iVar2 = 0;
  printf("The number of parameter variables = %d.\n",(ulong)uVar20);
  pVVar9 = Vec_WrdStart((iVar26 + 1) * p->nWords);
  pBVar25 = local_190;
  p->vInfo = pVVar9;
  iVar4 = p->nVars;
  iVar3 = 0;
  if (0 < iVar4) {
    iVar3 = iVar4;
  }
  for (; iVar3 != iVar2; iVar2 = iVar2 + 1) {
    pwVar10 = Exa3_ManTruth(p,iVar2);
    Abc_TtIthVar(pwVar10,iVar2,iVar4);
  }
  p->vInfo = pVVar9;
  s = sat_solver_new();
  p->pSat = s;
  sat_solver_setnvars(s,uVar20);
  local_148 = pTruth[0];
  if ((pTruth[0] & 1) != 0) {
    Abc_TtNot(pTruth,p->nWords);
  }
  local_1a4 = pBVar25->fOnlyAnd;
  uVar17 = (ulong)p->nVars;
  paaiVar19 = p->VarMarks + uVar17;
  paiVar23 = p->VarMarks[uVar17] + 1;
  while (uVar11 = (ulong)p->nObjs, (long)uVar17 < (long)uVar11) {
    uVar20 = ((int)uVar17 - p->nVars) * p->LutMask;
    local_160 = (ulong)uVar20;
    local_168 = CONCAT44(local_168._4_4_,uVar20 + 1);
    paaiVar22 = (int (*) [6] [32])0x0;
    local_198 = paiVar23;
    local_180 = paaiVar19;
    local_178 = uVar17;
    local_170 = paaiVar19;
    local_158 = paiVar23;
    while( true ) {
      iVar4 = p->nLutSize;
      if ((long)iVar4 <= (long)paaiVar22) break;
      uVar17 = 0;
      for (lVar21 = 0; iVar4 = (int)uVar17, lVar21 < (int)uVar11; lVar21 = lVar21 + 1) {
        iVar3 = (*local_180)[0][lVar21];
        if (iVar3 != 0) {
          iVar3 = Abc_Var2Lit(iVar3,0);
          uVar17 = (ulong)(iVar4 + 1);
          pLits[iVar4] = iVar3;
          uVar11 = (ulong)(uint)p->nObjs;
        }
      }
      if (iVar4 < 1) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                      ,0x4a3,"int Exa3_ManAddCnfStart(Exa3_Man_t *, int)");
      }
      local_188 = paaiVar22;
      iVar3 = sat_solver_addclause(p->pSat,pLits,pLits + uVar17);
      if (iVar3 == 0) goto LAB_004a89b5;
      lVar21 = 1;
      uVar11 = 0;
      while (uVar11 != uVar17) {
        lVar16 = lVar21;
        while ((int)lVar16 < iVar4) {
          local_1a0 = Abc_LitNot(pLits[uVar11]);
          local_19c = Abc_LitNot(pLits[lVar16]);
          iVar3 = sat_solver_addclause(p->pSat,&local_1a0,(lit *)&local_198);
          lVar16 = lVar16 + 1;
          if (iVar3 == 0) goto LAB_004a89b5;
        }
        lVar21 = lVar21 + 1;
        uVar11 = uVar11 + 1;
      }
      iVar4 = p->nLutSize;
      if (local_188 == (int (*) [6] [32])(ulong)(iVar4 - 1)) break;
      paaiVar22 = (int (*) [6] [32])((long)(*local_188)[0] + 1);
      uVar11 = (ulong)(uint)p->nObjs;
      uVar17 = local_178;
      paaiVar19 = local_188;
      paiVar23 = local_198;
      for (lVar21 = 0; lVar21 < (int)uVar11; lVar21 = lVar21 + 1) {
        if (local_150[uVar17][(long)paaiVar19][lVar21] != 0) {
          paiVar1 = local_150[uVar17] + (long)paaiVar19;
          for (lVar16 = 0; uVar17 = local_178, paaiVar19 = local_188,
              lVar21 + lVar16 < (long)(int)uVar11; lVar16 = lVar16 + 1) {
            if ((*paiVar23)[lVar16] != 0) {
              local_1a0 = Abc_Var2Lit((*paiVar1)[lVar21],1);
              local_19c = Abc_Var2Lit((*paiVar23)[lVar16],1);
              iVar4 = sat_solver_addclause(p->pSat,&local_1a0,(lit *)&local_198);
              if (iVar4 == 0) goto LAB_004a89b5;
              uVar11 = (ulong)(uint)p->nObjs;
            }
          }
        }
        paiVar23 = (int (*) [32])(*paiVar23 + 1);
      }
      local_180 = (int (*) [6] [32])(*local_180 + 1);
      local_198 = local_198 + 1;
    }
    if (iVar4 == 2) {
      iVar4 = (int)local_160 + 2;
      iVar3 = (int)local_160 + 3;
      iVar2 = 0;
      while (iVar2 != 3) {
        pLits[0] = Abc_Var2Lit((int)local_168,(uint)(iVar2 == 1));
        pLits[1] = Abc_Var2Lit(iVar4,(uint)(iVar2 == 2));
        pLits[2] = Abc_Var2Lit(iVar3,(uint)(iVar2 != 0));
        iVar26 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
        iVar2 = iVar2 + 1;
        if (iVar26 == 0) goto LAB_004a89b5;
      }
      if (local_1a4 != 0) {
        pLits[0] = Abc_Var2Lit((int)local_168,1);
        pLits[1] = Abc_Var2Lit(iVar4,1);
        pLits[2] = Abc_Var2Lit(iVar3,0);
        iVar4 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
        if (iVar4 == 0) goto LAB_004a89b5;
      }
    }
    paaiVar19 = local_170 + 1;
    paiVar23 = local_158 + 6;
    uVar17 = local_178 + 1;
  }
  iVar4 = 0;
  while (iVar4 < p->nObjs + -1) {
    pVVar12 = Vec_WecEntry(p->vOutLits,iVar4);
    if ((long)pVVar12->nSize < 1) {
      __assert_fail("Vec_IntSize(vArray) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                    ,0x4e1,"int Exa3_ManAddCnfStart(Exa3_Man_t *, int)");
    }
    iVar3 = sat_solver_addclause(p->pSat,pVVar12->pArray,pVVar12->pArray + pVVar12->nSize);
    iVar4 = iVar4 + 1;
    if (iVar3 == 0) {
LAB_004a89b5:
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                    ,0x52c,"void Exa3_ManExactSynthesis2(Bmc_EsPar_t *)");
    }
  }
  printf("Running exact synthesis for %d-input function with %d %d-input LUTs...\n",
         (ulong)(uint)p->nVars,(ulong)(uint)p->nNodes);
  iVar4 = 0;
  pBVar25 = local_190;
  do {
    if (iMint == -1) {
LAB_004a904d:
      printf("Realization of given %d-input function using %d %d-input LUTs:\n",
             (ulong)(uint)p->nVars,(ulong)(uint)p->nNodes,(ulong)(uint)p->nLutSize);
      uVar20 = p->nObjs;
      uVar7 = uVar20;
      while( true ) {
        uVar20 = uVar20 - 1;
        iVar4 = p->nVars;
        if ((int)uVar7 <= iVar4) break;
        uVar27 = uVar7 - 1;
        iVar3 = p->LutMask;
        printf("%02d = %d\'b",(ulong)uVar27,(ulong)(uint)(1 << ((byte)p->nLutSize & 0x1f)));
        for (iVar2 = p->LutMask; 0 < iVar2; iVar2 = iVar2 + -1) {
          uVar6 = sat_solver_var_value(p->pSat,(uVar20 - iVar4) * iVar3 + iVar2);
          printf("%d",(ulong)(uVar7 == p->nObjs & (byte)local_148 ^ uVar6));
        }
        pcVar24 = "0(";
        if (uVar7 == p->nObjs) {
          pcVar24 = "1(";
        }
        if ((local_148 & 1) == 0) {
          pcVar24 = "0(";
        }
        printf(pcVar24);
        iVar4 = p->nLutSize;
        while (0 < iVar4) {
          iVar4 = iVar4 + -1;
          uVar7 = Exa3_ManFindFanin(p,uVar27,iVar4);
          if (((int)uVar7 < 0) || (p->nVars <= (int)uVar7)) {
            pcVar24 = " %02d";
          }
          else {
            uVar7 = uVar7 + 0x61;
            pcVar24 = " %c";
          }
          printf(pcVar24,(ulong)uVar7);
        }
        puts(" )");
        uVar7 = uVar27;
      }
LAB_004a8ff3:
      sat_solver_delete(p->pSat);
      Vec_WrdFree(p->vInfo);
      Vec_WecFree(p->vOutLits);
      free(p);
      aVar8 = Abc_Clock();
      Abc_PrintTime(0x7a9015,(char *)(aVar8 - local_140),time_00);
      return;
    }
    local_170 = (int (*) [6] [32])CONCAT44(local_170._4_4_,iVar4);
    local_158 = (int (*) [32])Abc_Clock();
    uVar17 = p->pTruth[iMint >> 6];
    bVar14 = (byte)iMint;
    uVar11 = (ulong)(uint)p->nVars;
    if (p->nVars < 1) {
      uVar11 = 0;
    }
    for (uVar18 = 0; uVar11 != uVar18; uVar18 = uVar18 + 1) {
      p->VarVals[uVar18] = (uint)(((uint)iMint >> ((uint)uVar18 & 0x1f) & 1) != 0);
    }
    sat_solver_setnvars(p->pSat,(p->nLutSize + 1) * p->nNodes + p->iVar);
    for (paaiVar19 = (int (*) [6] [32])(long)p->nVars; uVar11 = (ulong)p->nObjs,
        (long)paaiVar19 < (long)uVar11; paaiVar19 = (int (*) [6] [32])((long)(*paaiVar19)[0] + 1)) {
      iVar4 = p->nLutSize;
      local_160 = CONCAT44(local_160._4_4_,p->nVars);
      iVar3 = (int)paaiVar19 - p->nVars;
      local_168 = (ulong)(uint)(p->LutMask * iVar3);
      local_198 = (int (*) [32])(ulong)(uint)p->iVar;
      local_1a4 = iVar4 + 1;
      local_178 = (ulong)(uint)(iVar3 * local_1a4 + p->iVar);
      local_188 = paaiVar19;
      for (paaiVar22 = (int (*) [6] [32])0x0; (long)paaiVar22 < (long)iVar4;
          paaiVar22 = (int (*) [6] [32])((long)(*paaiVar22)[0] + 1)) {
        iVar4 = (int)local_178;
        iVar3 = (int)paaiVar22;
        local_180 = paaiVar22;
        for (lVar21 = 0; lVar21 < (int)uVar11; lVar21 = lVar21 + 1) {
          if (local_150[(long)paaiVar19][(long)paaiVar22][lVar21] != 0) {
            paaiVar19 = local_150 + (long)paaiVar19;
            iVar2 = p->nLutSize;
            iVar26 = p->nVars;
            iVar15 = p->iVar;
            for (uVar20 = 0; uVar20 != 2; uVar20 = uVar20 + 1) {
              pLits[0] = Abc_Var2Lit((*paaiVar19)[(long)paaiVar22][lVar21],1);
              pLits[1] = Abc_Var2Lit(iVar4 + iVar3,uVar20);
              if (lVar21 < p->nVars) {
                end = pLits + 2;
                if (uVar20 != p->VarVals[lVar21]) goto LAB_004a8bbe;
              }
              else {
                pLits[2] = Abc_Var2Lit(p->nLutSize + ((int)lVar21 - iVar26) * (iVar2 + 1) + iVar15,
                                       uVar20 ^ 1);
                end = pLits + 3;
LAB_004a8bbe:
                iVar5 = sat_solver_addclause(p->pSat,pLits,end);
                if (iVar5 == 0) goto LAB_004a8fe7;
              }
            }
            uVar11 = (ulong)(uint)p->nObjs;
            paaiVar19 = local_188;
            paaiVar22 = local_180;
          }
        }
        iVar4 = p->nLutSize;
        pBVar25 = local_190;
      }
      iVar4 = (int)paaiVar19;
      local_198 = (int (*) [32])(ulong)(uint)((int)local_198 + (iVar4 - (int)local_160) * local_1a4)
      ;
      for (uVar20 = 0; uVar20 != 2; uVar20 = uVar20 + 1) {
        if ((p->nObjs + -1 != iVar4) || (uVar20 != ((uint)(uVar17 >> (bVar14 & 0x3f)) & 1))) {
          for (uVar7 = 0; paiVar23 = local_198, (int)uVar7 <= p->LutMask; uVar7 = uVar7 + 1) {
            if ((uVar20 ^ 1) != 0 || uVar7 != 0) {
              uVar11 = 0;
              while( true ) {
                uVar27 = (uint)uVar11;
                if (p->nLutSize <= (int)uVar27) break;
                iVar3 = Abc_Var2Lit((int)paiVar23 + uVar27,
                                    (uint)((uVar7 >> (uVar27 & 0x1f) & 1) != 0));
                pLits[uVar11] = iVar3;
                uVar11 = uVar11 + 1;
              }
              if (p->nObjs + -1 != iVar4) {
                iVar3 = Abc_Var2Lit((int)paiVar23 + uVar27,uVar20 ^ 1);
                uVar18 = uVar11 & 0xffffffff;
                uVar11 = (ulong)(uVar27 + 1);
                pLits[uVar18] = iVar3;
              }
              iVar3 = (int)uVar11;
              if (uVar7 != 0) {
                iVar2 = Abc_Var2Lit((int)local_168 + uVar7,uVar20);
                lVar21 = (long)iVar3;
                iVar3 = iVar3 + 1;
                pLits[lVar21] = iVar2;
              }
              if (p->nLutSize + 2 < iVar3) {
                __assert_fail("nLits <= p->nLutSize+2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                              ,0x518,"int Exa3_ManAddCnf(Exa3_Man_t *, int)");
              }
              iVar3 = sat_solver_addclause(p->pSat,pLits,pLits + iVar3);
              if (iVar3 == 0) goto LAB_004a8fe7;
            }
          }
        }
        pBVar25 = local_190;
      }
    }
    p->iVar = p->iVar + (p->nLutSize + 1) * p->nNodes;
    iVar4 = sat_solver_solve(p->pSat,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (pBVar25->fVerbose != 0) {
      printf("Iter %3d : ",(ulong)local_170 & 0xffffffff);
      Extra_PrintBinary(_stdout,(uint *)&iMint,p->nVars);
      printf("  Var =%5d  ",(ulong)(uint)p->iVar);
      uVar20 = sat_solver_nclauses(p->pSat);
      printf("Cla =%6d  ",(ulong)uVar20);
      uVar20 = sat_solver_nconflicts(p->pSat);
      printf("Conf =%9d  ",(ulong)uVar20);
      aVar8 = Abc_Clock();
      Abc_PrintTime(0x82525c,(char *)(aVar8 - (long)local_158),time);
    }
    if (iVar4 == -1) {
      puts("The problem has no solution.");
LAB_004a8fe7:
      if (iMint != -1) goto LAB_004a8ff3;
      goto LAB_004a904d;
    }
    for (iVar4 = p->nVars; iVar4 < p->nObjs; iVar4 = iVar4 + 1) {
      iVar3 = p->nVars;
      iVar2 = p->LutMask;
      for (lVar21 = 0; lVar21 < p->nLutSize; lVar21 = lVar21 + 1) {
        iVar26 = Exa3_ManFindFanin(p,iVar4,(int)lVar21);
        pwVar10 = Exa3_ManTruth(p,iVar26);
        pTruth[lVar21 + -0x10] = (word)pwVar10;
      }
      pwVar10 = Exa3_ManTruth(p,iVar4);
      Abc_TtConst0(pwVar10,p->nWords);
      for (uVar20 = 1; (int)uVar20 <= p->LutMask; uVar20 = uVar20 + 1) {
        iVar26 = sat_solver_var_value(p->pSat,(iVar4 - iVar3) * iVar2 + uVar20);
        if (iVar26 != 0) {
          pwVar10 = Exa3_ManTruth(p,p->nObjs);
          uVar17 = (ulong)(uint)p->nWords;
          if (p->nWords < 1) {
            uVar17 = 0;
          }
          for (uVar11 = 0; uVar17 != uVar11; uVar11 = uVar11 + 1) {
            pwVar10[uVar11] = 0xffffffffffffffff;
          }
          for (lVar21 = 0; lVar21 < p->nLutSize; lVar21 = lVar21 + 1) {
            pwVar10 = Exa3_ManTruth(p,p->nObjs);
            pwVar13 = Exa3_ManTruth(p,p->nObjs);
            Abc_TtAndCompl(pwVar10,pwVar13,0,(word *)pTruth[lVar21 + -0x10],
                           (uint)((~uVar20 >> ((uint)lVar21 & 0x1f) & 1) != 0),p->nWords);
          }
          pwVar10 = Exa3_ManTruth(p,iVar4);
          pwVar13 = Exa3_ManTruth(p,iVar4);
          pIn2 = Exa3_ManTruth(p,p->nObjs);
          Abc_TtOr(pwVar10,pwVar13,pIn2,p->nWords);
        }
      }
      pBVar25 = local_190;
    }
    pwVar10 = Exa3_ManTruth(p,p->nObjs + -1);
    iVar4 = p->nVars;
    iVar3 = Abc_TtFindFirstDiffBit(pwVar10,p->pTruth,iVar4);
    if (1 << ((byte)iVar4 & 0x1f) <= iVar3) {
      __assert_fail("iMint < (1 << p->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                    ,0x451,"int Exa3_ManEval(Exa3_Man_t *)");
    }
    iVar4 = (int)local_170 + 1;
    iMint = iVar3;
  } while( true );
}

Assistant:

void Exa3_ManExactSynthesis2( Bmc_EsPar_t * pPars )
{
    int i, status, iMint = 1;
    abctime clkTotal = Abc_Clock();
    Exa3_Man_t * p; int fCompl = 0;
    word pTruth[16]; Abc_TtReadHex( pTruth, pPars->pTtStr );
    assert( pPars->nVars <= 10 );
    assert( pPars->nLutSize <= 6 );
    p = Exa3_ManAlloc( pPars, pTruth );
    if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, p->nWords ); }
    status = Exa3_ManAddCnfStart( p, pPars->fOnlyAnd );
    assert( status );
    printf( "Running exact synthesis for %d-input function with %d %d-input LUTs...\n", p->nVars, p->nNodes, p->nLutSize );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Exa3_ManAddCnf( p, iMint ) )
            break;
        status = sat_solver_solve( p->pSat, NULL, NULL, 0, 0, 0, 0 );
        if ( pPars->fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", sat_solver_nclauses(p->pSat) );
            printf( "Conf =%9d  ", sat_solver_nconflicts(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == l_False )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        iMint = Exa3_ManEval( p );
    }
    if ( iMint == -1 )
        Exa3_ManPrintSolution( p, fCompl );
    Exa3_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
}